

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O1

void __thiscall
PlantUmlGenerator::deferralLink
          (PlantUmlGenerator *this,ostream *output,string *indent,ScName *stateAlias,
          ScName *eventName)

{
  const_iterator cVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ScName eventNameShort;
  ScName local_48;
  
  removeNamespaces(&local_48,eventName);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->super_AbstractGenerator).m_highlightSet._M_t,eventName);
  pcVar4 = (indent->_M_dataplus)._M_p;
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->super_AbstractGenerator).m_highlightSet._M_t._M_impl.super__Rb_tree_header) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,pcVar4,indent->_M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(stateAlias->_M_dataplus)._M_p,stateAlias->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," : * ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    lVar3 = 1;
    pcVar4 = "\n";
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (output,pcVar4,indent->_M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(stateAlias->_M_dataplus)._M_p,stateAlias->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," : * <b>",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    lVar3 = 5;
    pcVar4 = "</b>\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PlantUmlGenerator::deferralLink(std::ostream &output, std::string &indent,
                                     const ScName &stateAlias, const ScName &eventName)
{
    const ScName eventNameShort = removeNamespaces(eventName);

    if (isHighlighted(eventName)) {
        output << indent << stateAlias << " : * <b>" << eventNameShort << "</b>\n";
    } else {
        output << indent << stateAlias << " : * " << eventNameShort << "\n";
    }
}